

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QNetworkCookiePrivate>::detach_helper
          (QSharedDataPointer<QNetworkCookiePrivate> *this)

{
  QNetworkCookiePrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  bool bVar4;
  QNetworkCookiePrivate *pQVar5;
  
  pQVar5 = (QNetworkCookiePrivate *)operator_new(0x90);
  pQVar1 = (this->d).ptr;
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  QDateTime::QDateTime(&pQVar5->expirationDate,&pQVar1->expirationDate);
  pDVar2 = (pQVar1->domain).d.d;
  (pQVar5->domain).d.d = pDVar2;
  (pQVar5->domain).d.ptr = (pQVar1->domain).d.ptr;
  (pQVar5->domain).d.size = (pQVar1->domain).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar2 = (pQVar1->path).d.d;
  (pQVar5->path).d.d = pDVar2;
  (pQVar5->path).d.ptr = (pQVar1->path).d.ptr;
  (pQVar5->path).d.size = (pQVar1->path).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar2 = (pQVar1->comment).d.d;
  (pQVar5->comment).d.d = pDVar2;
  (pQVar5->comment).d.ptr = (pQVar1->comment).d.ptr;
  (pQVar5->comment).d.size = (pQVar1->comment).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar3 = (pQVar1->name).d.d;
  (pQVar5->name).d.d = pDVar3;
  (pQVar5->name).d.ptr = (pQVar1->name).d.ptr;
  (pQVar5->name).d.size = (pQVar1->name).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar3 = (pQVar1->value).d.d;
  (pQVar5->value).d.d = pDVar3;
  (pQVar5->value).d.ptr = (pQVar1->value).d.ptr;
  (pQVar5->value).d.size = (pQVar1->value).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  bVar4 = pQVar1->httpOnly;
  pQVar5->secure = pQVar1->secure;
  pQVar5->httpOnly = bVar4;
  pQVar5->sameSite = pQVar1->sameSite;
  LOCK();
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QNetworkCookiePrivate *)0x0) {
      QNetworkCookiePrivate::~QNetworkCookiePrivate(pQVar1);
    }
    operator_delete(pQVar1,0x90);
  }
  (this->d).ptr = pQVar5;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}